

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifinp(bifcxdef *ctx,int argc)

{
  int iVar1;
  long in_RDI;
  char inbuf [128];
  undefined8 in_stack_ffffffffffffff58;
  int err;
  runcxdef *in_stack_ffffffffffffff60;
  char local_98 [20];
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  runcxdef *in_stack_ffffffffffffffa0;
  
  err = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  outflushn(0);
  outreset();
  iVar1 = getstring((char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                    in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if (iVar1 != 0) {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffff60,err);
  }
  strlen(local_98);
  runpushcstr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
              in_stack_ffffffffffffff8c);
  return;
}

Assistant:

void bifinp(bifcxdef *ctx, int argc)
{
    char inbuf[128];

    /* check for proper argument count */
    bifcntargs(ctx, 0, argc);

    /* make sure the prompt is displayed */
    tioflushn(ctx->bifcxtio, 0);

     /* reset count of lines since the last keyboard input */
    tioreset(ctx->bifcxtio);

    /* read a line of text */
    if (tiogets(ctx->bifcxtio, (char *)0, inbuf, (int)sizeof(inbuf)))
        runsig(ctx->bifcxrun, ERR_RUNQUIT);

    /* push the string, converting escapes */
    runpushcstr(ctx->bifcxrun, inbuf, strlen(inbuf), 0);
}